

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayoutengine_p.h
# Opt level: O2

int __thiscall
QGraphicsGridLayoutEngine::indexOf(QGraphicsGridLayoutEngine *this,QGraphicsLayoutItem *item)

{
  int i;
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (*(long *)&this->field_0x10 == lVar1) {
      return -1;
    }
    if (*(QGraphicsLayoutItem **)(*(long *)(*(long *)&this->field_0x8 + lVar1 * 8) + 0x28) == item)
    break;
    lVar1 = lVar1 + 1;
  }
  return (int)lVar1;
}

Assistant:

int indexOf(QGraphicsLayoutItem *item) const
    {
        for (int i = 0; i < q_items.size(); ++i) {
            if (item == static_cast<QGraphicsGridLayoutEngineItem*>(q_items.at(i))->layoutItem())
                return i;
        }
        return -1;
    }